

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O3

errr Term_wipe_x11(wchar_t x,wchar_t y,wchar_t n)

{
  int iVar1;
  int iVar2;
  
  Infoclr = clr[0];
  if (n < L'\x01') {
    n = L'\0';
  }
  iVar1 = *(int *)((long)Term->data + 0xe8);
  iVar2 = *(int *)((long)Term->data + 0xf0);
  XFillRectangle(metadpy_default_0,Infowin->win,clr[0]->gc,(int)Infowin->ox + iVar1 * x,
                 (int)Infowin->oy + y * iVar2,n * iVar1,iVar2);
  return 0;
}

Assistant:

static errr Term_wipe_x11(int x, int y, int n)
{
	/* Erase (use black) */
	Infoclr_set(clr[COLOUR_DARK]);

	/* Mega-Hack -- Erase some space */
	Infofnt_text_non(x, y, L"", n);

	/* Success */
	return (0);
}